

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
brotli::Command::Command
          (Command *this,size_t insertlen,size_t copylen,size_t copylen_code,size_t distance_code)

{
  size_t distance_code_local;
  size_t copylen_code_local;
  size_t copylen_local;
  size_t insertlen_local;
  Command *this_local;
  
  this->insert_len_ = (uint32_t)insertlen;
  this->copy_len_ = (uint32_t)copylen;
  PrefixEncodeCopyDistance(distance_code,0,0,&this->dist_prefix_,&this->dist_extra_);
  GetLengthCode(insertlen,copylen_code,this->dist_prefix_ == 0,&this->cmd_prefix_,&this->cmd_extra_)
  ;
  return;
}

Assistant:

Command(size_t insertlen, size_t copylen, size_t copylen_code,
          size_t distance_code)
      : insert_len_(static_cast<uint32_t>(insertlen))
      , copy_len_(static_cast<uint32_t>(copylen)) {
    // The distance prefix and extra bits are stored in this Command as if
    // npostfix and ndirect were 0, they are only recomputed later after the
    // clustering if needed.
    PrefixEncodeCopyDistance(distance_code, 0, 0, &dist_prefix_, &dist_extra_);
    GetLengthCode(insertlen, copylen_code, dist_prefix_ == 0,
                  &cmd_prefix_, &cmd_extra_);
  }